

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

fy_atom_iter * fy_atom_iter_create(fy_atom *atom)

{
  fy_atom_iter *iter;
  fy_atom *atom_local;
  
  atom_local = (fy_atom *)malloc(0x1e8);
  if ((fy_atom_iter *)atom_local == (fy_atom_iter *)0x0) {
    atom_local = (fy_atom *)0x0;
  }
  else if (atom == (fy_atom *)0x0) {
    memset(atom_local,0,0x1e8);
  }
  else {
    fy_atom_iter_start(atom,(fy_atom_iter *)atom_local);
  }
  return (fy_atom_iter *)atom_local;
}

Assistant:

struct fy_atom_iter *
fy_atom_iter_create(const struct fy_atom *atom) {
    struct fy_atom_iter *iter;

    iter = malloc(sizeof(*iter));
    if (!iter)
        return NULL;
    if (atom)
        fy_atom_iter_start(atom, iter);
    else
        memset(iter, 0, sizeof(*iter));
    return iter;
}